

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DecorationManager::WhileEachDecoration
          (DecorationManager *this,uint32_t id,uint32_t decoration,
          function<bool_(const_spvtools::opt::Instruction_&)> *f)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  pointer ppIVar3;
  uint32_t uVar4;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  local_40;
  uint uVar5;
  
  InternalGetDecorationsFor<spvtools::opt::Instruction_const*>(&local_40,this,id,true);
  ppIVar3 = local_40.
            super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_40.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_40.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    do {
      this_00 = *ppIVar3;
      OVar1 = this_00->opcode_;
      if ((int)OVar1 < 0x14c) {
        if (OVar1 == OpDecorate) goto LAB_001ef9ad;
        if (OVar1 != OpMemberDecorate) goto LAB_001efa2b;
        uVar5 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar5 = (uint)this_00->has_result_id_;
        }
        uVar4 = uVar5 + 2;
      }
      else {
        if ((OVar1 != OpDecorateId) && (OVar1 != OpDecorateString)) {
LAB_001efa2b:
          __assert_fail("false && \"Unexpected decoration instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x1e0,
                        "bool spvtools::opt::analysis::DecorationManager::WhileEachDecoration(uint32_t, uint32_t, std::function<bool (const Instruction &)>) const"
                       );
        }
LAB_001ef9ad:
        uVar5 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar5 = (uint)this_00->has_result_id_;
        }
        uVar4 = uVar5 + 1;
      }
      uVar4 = Instruction::GetSingleWordOperand(this_00,uVar4);
      if (uVar4 == decoration) {
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar2 = (*f->_M_invoker)((_Any_data *)f,this_00);
        if (!bVar2) {
          bVar2 = false;
          goto LAB_001efa02;
        }
      }
      ppIVar3 = ppIVar3 + 1;
    } while (ppIVar3 !=
             local_40.
             super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = true;
  }
LAB_001efa02:
  if (local_40.
      super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool DecorationManager::WhileEachDecoration(
    uint32_t id, uint32_t decoration,
    std::function<bool(const Instruction&)> f) const {
  for (const Instruction* inst : GetDecorationsFor(id, true)) {
    switch (inst->opcode()) {
      case spv::Op::OpMemberDecorate:
        if (inst->GetSingleWordInOperand(2) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      case spv::Op::OpDecorate:
      case spv::Op::OpDecorateId:
      case spv::Op::OpDecorateStringGOOGLE:
        if (inst->GetSingleWordInOperand(1) == decoration) {
          if (!f(*inst)) return false;
        }
        break;
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
  return true;
}